

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O0

void * zt_threadpool_get_oput(zt_threadpool *tpool)

{
  long in_RDI;
  void *data;
  zt_threadpool_entry *entry;
  zt_threads_mutex *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined8 *local_18;
  void *local_8;
  
  local_18 = (undefined8 *)0x0;
  zt_threads_lock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*(long *)(in_RDI + 0x60) != 0) {
    local_18 = *(undefined8 **)(in_RDI + 0x60);
    if (local_18[1] == 0) {
      *(undefined8 *)(in_RDI + 0x68) = local_18[2];
    }
    else {
      *(undefined8 *)(local_18[1] + 0x10) = local_18[2];
    }
    *(undefined8 *)local_18[2] = local_18[1];
  }
  zt_threads_unlock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_18 == (undefined8 *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)*local_18;
    free(local_18);
  }
  return local_8;
}

Assistant:

void *
zt_threadpool_get_oput(zt_threadpool *tpool) {
    zt_threadpool_entry *entry = NULL;
    void                *data;

    zt_threads_lock(0, tpool->oput_mutex);

    do {
        if (TAILQ_EMPTY(&tpool->oput_queue)) {
            break;
        }

        entry = TAILQ_FIRST(&tpool->oput_queue);
        TAILQ_REMOVE(&tpool->oput_queue, entry, next);
    } while (0);

    zt_threads_unlock(0, tpool->oput_mutex);

    if (entry == NULL) {
        return NULL;
    }

    data = entry->data;
    free(entry);

    return data;
}